

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestSignalingNanSingle(void)

{
  bool bVar1;
  undefined1 in_CL;
  Single local_1c;
  Single local_18;
  Single nan;
  
  nan.d32_ = 0x7fc00000;
  CheckHelper((char *)0x1cb,0xc1d2fa,(char *)0x1,(bool)in_CL);
  bVar1 = double_conversion::Single::IsQuietNan(&nan);
  CheckHelper((char *)0x1cc,0xc1d306,(char *)(ulong)bVar1,(bool)in_CL);
  local_18.d32_ = 0x7fc00000;
  bVar1 = double_conversion::Single::IsQuietNan(&local_18);
  CheckHelper((char *)0x1cd,0xc1d39b,(char *)(ulong)bVar1,(bool)in_CL);
  local_1c.d32_ = 0x7fa00000;
  bVar1 = double_conversion::Single::IsSignalingNan(&local_1c);
  CheckHelper((char *)0x1ce,0xc1d3d8,(char *)(ulong)bVar1,(bool)in_CL);
  return;
}

Assistant:

TEST(SignalingNanSingle) {
  Single nan(Single::NaN());
  CHECK(nan.IsNan());
  CHECK(nan.IsQuietNan());
  CHECK(Single(std::numeric_limits<float>::quiet_NaN()).IsQuietNan());
  CHECK(Single(std::numeric_limits<float>::signaling_NaN()).IsSignalingNan());
}